

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

void __thiscall HighsNodeQueue::unlink_lower(HighsNodeQueue *this,int64_t node)

{
  NodeLowerRbTree rbTree;
  CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> local_18;
  HighsNodeQueue *local_8;
  
  local_18.super_RbTree<HighsNodeQueue::NodeLowerRbTree>.rootNode = &this->lowerRoot;
  local_18.first_ = &this->lowerMin;
  local_8 = this;
  ::highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::unlink(&local_18,(char *)node);
  return;
}

Assistant:

void HighsNodeQueue::unlink_lower(int64_t node) {
  assert(node != -1);
  NodeLowerRbTree rbTree(this);
  rbTree.unlink(node);
}